

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O2

void __thiscall ON_SerialNumberMap::EmptyList(ON_SerialNumberMap *this)

{
  ON_SerialNumberMapPrivate *pOVar1;
  ON_SN_BLOCK *pOVar2;
  ON__UINT32 i;
  ulong uVar3;
  ON__UINT64 OVar4;
  bool bVar5;
  
  pOVar1 = this->m_private;
  pOVar1->m_maxsn = 0;
  pOVar1->m_lower_maxsn = 0;
  this->m_sn_count = 0;
  this->m_sn_purged = 0;
  pOVar2 = this->m_sn_block0;
  pOVar2->m_count = 0;
  pOVar2->m_purged = 0;
  pOVar2->m_sorted = 1;
  pOVar2->m_sn0 = 0;
  pOVar2->m_sn1 = 0;
  if (this->m_snblk_list != (ON_SN_BLOCK **)0x0) {
    OVar4 = this->m_snblk_list_capacity;
    while( true ) {
      bVar5 = OVar4 == 0;
      OVar4 = OVar4 - 1;
      if (bVar5) break;
      pOVar2 = this->m_snblk_list[OVar4];
      if (pOVar2 != (ON_SN_BLOCK *)0x0) {
        onfree(pOVar2);
      }
    }
    onfree(this->m_snblk_list);
    this->m_snblk_list_capacity = 0;
    this->m_snblk_list_count = 0;
    this->m_snblk_list = (ON_SN_BLOCK **)0x0;
  }
  this->m_bHashTableIsValid = '\0';
  if (this->m_hash_table_blocks != (SN_ELEMENT ***)0x0) {
    for (uVar3 = 1; uVar3 < this->m_hash_block_count; uVar3 = uVar3 + 1) {
      onfree(this->m_hash_table_blocks[uVar3]);
    }
    onfree(this->m_hash_table_blocks);
    this->m_hash_table_blocks = (SN_ELEMENT ***)0x0;
  }
  this->m_active_id_count = 0;
  return;
}

Assistant:

void ON_SerialNumberMap::EmptyList()
{
  m_private->SetMaxSn(0);
  m_sn_count = 0;
  m_sn_purged = 0;
  m_sn_block0.EmptyBlock();
  if (m_snblk_list)
  {
    ON__UINT64 i = m_snblk_list_capacity;
    while(i--)
    {
      if ( 0 != m_snblk_list[i] )
        onfree(m_snblk_list[i]);
    }
    onfree(m_snblk_list);
    m_snblk_list = 0;
    m_snblk_list_capacity = 0;
    m_snblk_list_count = 0;
  }
  m_bHashTableIsValid = false;
  if (nullptr != m_hash_table_blocks)
  {
    // Starts at i = 1 because m_hash_table_blocks[] and m_hash_table_blocks[0] 
    // are a single allocation.
    for (ON__UINT32 i = 1; i < m_hash_block_count; i++)
      onfree(m_hash_table_blocks[i]);
    onfree(m_hash_table_blocks); // includes m_hash_table_blocks[0].
    m_hash_table_blocks = nullptr;
  }
  m_active_id_count = 0;
}